

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

Vec_Int_t * Abc_SclFindCriticalNodeWindow(SC_Man *p,Vec_Int_t *vPathCos,int Window,int fDept)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  Vec_Int_t *vPath_00;
  Abc_Obj_t *pAVar3;
  float fVar4;
  float fVar5;
  int local_3c;
  float fSlackThis;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vPath;
  float fSlackMax;
  float fMaxArr;
  int fDept_local;
  int Window_local;
  Vec_Int_t *vPathCos_local;
  SC_Man *p_local;
  
  fVar4 = Abc_SclReadMaxDelay(p);
  vPath_00 = Vec_IntAlloc(100);
  Abc_NtkIncrementTravId(p->pNtk);
  for (local_3c = 0; iVar2 = Vec_IntSize(vPathCos), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar1 = p->pNtk;
    iVar2 = Vec_IntEntry(vPathCos,local_3c);
    pAVar3 = Abc_NtkObj(pAVar1,iVar2);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      fVar5 = Abc_SclObjTimeMax(p,pAVar3);
      fVar5 = (fVar4 * (float)Window) / 100.0 - (fVar4 - fVar5);
      if (0.0 <= fVar5) {
        pAVar3 = Abc_ObjFanin0(pAVar3);
        Abc_SclFindCriticalNodeWindow_rec(p,pAVar3,vPath_00,fVar5,fDept);
      }
    }
  }
  for (local_3c = 0; iVar2 = Vec_IntSize(vPathCos), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar1 = p->pNtk;
    iVar2 = Vec_IntEntry(vPathCos,local_3c);
    pAVar3 = Abc_NtkObj(pAVar1,iVar2);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef | 0x10;
    }
  }
  for (local_3c = 0; iVar2 = Vec_IntSize(vPath_00), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar1 = p->pNtk;
    iVar2 = Vec_IntEntry(vPath_00,local_3c);
    pAVar3 = Abc_NtkObj(pAVar1,iVar2);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef | 0x10;
    }
  }
  return vPath_00;
}

Assistant:

Vec_Int_t * Abc_SclFindCriticalNodeWindow( SC_Man * p, Vec_Int_t * vPathCos, int Window, int fDept )
{
    float fMaxArr = Abc_SclReadMaxDelay( p );
    float fSlackMax = fMaxArr * Window / 100.0;
    Vec_Int_t * vPath = Vec_IntAlloc( 100 );
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( p->pNtk ); 
    Abc_NtkForEachObjVec( vPathCos, p->pNtk, pObj, i )
    {
        float fSlackThis = fSlackMax - (fMaxArr - Abc_SclObjTimeMax(p, pObj));
        if ( fSlackThis >= 0 )
            Abc_SclFindCriticalNodeWindow_rec( p, Abc_ObjFanin0(pObj), vPath, fSlackThis, fDept );
    }
    // label critical nodes
    Abc_NtkForEachObjVec( vPathCos, p->pNtk, pObj, i )
        pObj->fMarkA = 1;
    Abc_NtkForEachObjVec( vPath, p->pNtk, pObj, i )
        pObj->fMarkA = 1;
    return vPath;  
}